

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::ComputeUnknownFieldsSize
                 (InternalMetadataWithArena *metadata,size_t total_size,CachedSize *cached_size)

{
  size_t sVar1;
  CachedSize *in_RDX;
  long in_RSI;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_RDI;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *pIVar2;
  
  pIVar2 = in_RDI;
  if (((uint)*(undefined8 *)in_RDI & 1) == 1) {
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              (in_RDI);
  }
  else {
    InternalMetadataWithArena::default_instance();
  }
  sVar1 = WireFormat::ComputeUnknownFieldsSize((UnknownFieldSet *)pIVar2);
  ToCachedSize(sVar1 + in_RSI);
  CachedSize::Set(in_RDX,(int)((ulong)in_RDI >> 0x20));
  return sVar1 + in_RSI;
}

Assistant:

size_t ComputeUnknownFieldsSize(const InternalMetadataWithArena& metadata,
                                size_t total_size, CachedSize* cached_size) {
  total_size += WireFormat::ComputeUnknownFieldsSize(metadata.unknown_fields());
  cached_size->Set(ToCachedSize(total_size));
  return total_size;
}